

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O3

void __thiscall asl::SockClientThread::run(SockClientThread *this)

{
  AtomicCount *pAVar1;
  SocketServer *pSVar2;
  SmartObject local_10;
  
  pSVar2 = this->_server;
  local_10._p = (this->_client).super_SmartObject._p;
  if (local_10._p != (SmartObject_ *)0x0) {
    LOCK();
    ((local_10._p)->rc).n = ((local_10._p)->rc).n + 1;
    UNLOCK();
  }
  (**pSVar2->_vptr_SocketServer)(pSVar2,&local_10);
  if (local_10._p != (SmartObject_ *)0x0) {
    LOCK();
    pAVar1 = &(local_10._p)->rc;
    pAVar1->n = pAVar1->n + -1;
    UNLOCK();
    if ((pAVar1->n == 0) && (local_10._p != (SmartObject_ *)0x0)) {
      (*(local_10._p)->_vptr_SmartObject_[1])();
    }
  }
  (*((this->_client).super_SmartObject._p)->_vptr_SmartObject_[0xb])();
  LOCK();
  pAVar1 = &this->_server->_numClients;
  pAVar1->n = pAVar1->n + -1;
  UNLOCK();
  (*(this->super_Thread)._vptr_Thread[1])(this);
  return;
}

Assistant:

void run()
	{
		_server->serve(_client);
		_client.close();
		--_server->_numClients;
		delete this;
	}